

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_getutxos(any *context,HTTPRequest *req,string *strURIPart)

{
  long lVar1;
  string_view hex;
  Span<const_std::byte> s;
  string_view str;
  string_view reply;
  string_view reply_00;
  string_view str_00;
  string_view hex_str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  bool bVar2;
  RESTResponseFormat RVar3;
  CCoinsViewMemPool *in_RAX;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  ChainstateManager *pCVar7;
  CTxMemPool *pCVar8;
  byte *pbVar9;
  reference pCVar10;
  long in_FS_OFFSET;
  UniValue *obj;
  undefined6 in_stack_fffffffffffff008;
  undefined1 in_stack_fffffffffffff00e;
  undefined1 in_stack_fffffffffffff00f;
  UniValue *in_stack_fffffffffffff010;
  undefined4 in_stack_fffffffffffff018;
  int in_stack_fffffffffffff01c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff020;
  undefined7 in_stack_fffffffffffff028;
  char in_stack_fffffffffffff02f;
  UniValue *in_stack_fffffffffffff030;
  allocator<char> *paVar11;
  CTxMemPool *in_stack_fffffffffffff038;
  string *key;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff040;
  UniValue *pUVar12;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff048;
  string *in_stack_fffffffffffff050;
  undefined8 in_stack_fffffffffffff058;
  HTTPStatusCode HVar13;
  HTTPRequest *in_stack_fffffffffffff060;
  string *in_stack_fffffffffffff068;
  string *in_stack_fffffffffffff070;
  undefined8 in_stack_fffffffffffff078;
  int iVar14;
  HTTPRequest *in_stack_fffffffffffff080;
  SigningProvider *provider;
  CScript *script;
  pointer in_stack_fffffffffffff0b0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff0b8;
  CCoin *coin;
  vector<CCoin,_std::allocator<CCoin>_> *__range2;
  bool hit;
  size_t i_1;
  CCoinsViewCache *viewChain;
  CTxMemPool *mempool;
  ChainstateManager *chainman;
  ChainstateManager *maybe_chainman;
  failure *anon_var_0;
  size_t i;
  bool fInputParsed;
  RESTResponseFormat rf;
  string *strURIPart_local;
  HTTPRequest *req_local;
  any *context_local;
  bool local_c8e;
  allocator<char> local_c8d;
  allocator<char> local_c8c;
  undefined1 local_c8b [2];
  allocator<char> local_c89;
  uint32_t local_c88;
  allocator<char> local_c81;
  iterator __end2;
  iterator __begin2;
  allocator<char> local_c6d;
  undefined1 local_c6c;
  undefined1 local_c6b [2];
  allocator<char> local_c69 [17];
  DataStream ssGetUTXOResponse_1;
  allocator<char> local_c1a;
  allocator<char> local_c19;
  DataStream ssGetUTXOResponse;
  CCoinsViewMemPool viewMempool;
  anon_class_48_6_125dcb17 process_utxos;
  int active_height;
  vector<CCoin,_std::allocator<CCoin>_> outs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  allocator<char> local_aca [2];
  DataStream oss;
  allocator<char> local_a99;
  vector<unsigned_char,_std::allocator<unsigned_char>_> strRequestV;
  allocator<char> local_a7a;
  allocator<char> local_a79;
  size_t local_a78;
  char *pcStack_a70;
  size_t local_a68;
  char *pcStack_a60;
  allocator<char> local_a49 [17];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  txid_out;
  vector<COutPoint,_std::allocator<COutPoint>_> vOutPoints;
  bool fCheckMemPool;
  allocator<char> local_a01 [25];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriParts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  vector<bool,_std::allocator<bool>_> hits;
  optional<unsigned_int> output;
  undefined1 local_8d0 [32];
  string strJSON;
  anon_class_48_6_125dcb17 local_818 [5];
  UniValue o;
  UniValue utxo;
  SigningProvider local_568 [4];
  UniValue utxos;
  UniValue objGetUTXOResponse;
  string strHex;
  uint256 active_hash;
  string bitmapStringRepresentation;
  optional<transaction_identifier<false>_> txid;
  string strRequestMutable;
  string strUriParams;
  string param;
  
  obj = (UniValue *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup((HTTPRequest *)in_stack_fffffffffffff030);
  if (!bVar2) {
    local_c8e = false;
    goto LAB_0125f6f7;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff010);
  RVar3 = ParseDataFormat(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RAX);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
  if (1 < sVar4) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffff020,
               CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
               (size_type)in_stack_fffffffffffff010);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
    str._M_str = (char *)in_stack_fffffffffffff038;
    str._M_len = (size_t)in_stack_fffffffffffff030;
    util::SplitString_abi_cxx11_(str,(char)((ulong)in_stack_fffffffffffff010 >> 0x38));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)obj);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff00f,
                          CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
  }
  HTTPRequest::ReadBody_abi_cxx11_((HTTPRequest *)in_stack_fffffffffffff068);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
  if (sVar4 == 0) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RAX);
    HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
    if (sVar5 != 0) goto LAB_0125d01f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff048._M_current,(char *)in_stack_fffffffffffff040._M_current,
               (allocator<char> *)in_stack_fffffffffffff038);
    local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
    std::allocator<char>::~allocator(local_a01);
  }
  else {
LAB_0125d01f:
    bVar2 = false;
    fCheckMemPool = false;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_RAX);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RAX);
    if (sVar5 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff00f,
                               CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   (size_type)obj);
      fCheckMemPool =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff00f,
                                    CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                           (char *)obj);
      for (i = (size_t)(int)(uint)fCheckMemPool;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_RAX), i < sVar5; i = i + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff00f,
                                 CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                     (size_type)obj);
        Span<char_const>::Span<std::__cxx11::string>
                  ((Span<const_char> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj,in_RAX);
        util::Split<std::basic_string_view<char,std::char_traits<char>>>
                  ((Span<const_char> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   in_stack_fffffffffffff02f);
        sVar5 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)in_RAX);
        if (sVar5 == 2) {
          pvVar6 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::at((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff00f,
                                    CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                        (size_type)obj);
          local_a68 = pvVar6->_M_len;
          pcStack_a60 = pvVar6->_M_str;
          hex._M_len._4_4_ = in_stack_fffffffffffff01c;
          hex._M_len._0_4_ = in_stack_fffffffffffff018;
          hex._M_str = (char *)in_stack_fffffffffffff020;
          transaction_identifier<false>::FromHex(hex);
          pvVar6 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::at((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff00f,
                                    CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                        (size_type)obj);
          local_a78 = pvVar6->_M_len;
          pcStack_a70 = pvVar6->_M_str;
          str_00._M_str = (char *)in_stack_fffffffffffff040._M_current;
          str_00._M_len = (size_t)in_stack_fffffffffffff038;
          ToIntegral<unsigned_int>(str_00);
          bVar2 = std::optional::operator_cast_to_bool
                            ((optional<transaction_identifier<false>_> *)in_RAX);
          if ((bVar2) &&
             (bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)in_RAX), bVar2)
             ) {
            std::optional<transaction_identifier<false>_>::operator*
                      ((optional<transaction_identifier<false>_> *)in_RAX);
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_RAX);
            std::vector<COutPoint,std::allocator<COutPoint>>::
            emplace_back<transaction_identifier<false>&,unsigned_int&>
                      ((vector<COutPoint,_std::allocator<COutPoint>_> *)
                       CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       (transaction_identifier<false> *)in_stack_fffffffffffff010,
                       (uint *)CONCAT17(in_stack_fffffffffffff00f,
                                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008
                                                )));
            bVar2 = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            local_c8e = RESTERR(in_stack_fffffffffffff060,
                                (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20),
                                in_stack_fffffffffffff050);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_a79);
            bVar2 = true;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff048._M_current,
                     (char *)in_stack_fffffffffffff040._M_current,
                     (allocator<char> *)in_stack_fffffffffffff038);
          local_c8e = RESTERR(in_stack_fffffffffffff060,
                              (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20),
                              in_stack_fffffffffffff050);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
          std::allocator<char>::~allocator(local_a49);
          bVar2 = true;
        }
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff00f,
                              CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
        if (bVar2) goto LAB_0125f687;
      }
      sVar5 = std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                        ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_RAX);
      HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
      if (sVar5 != 0) {
        bVar2 = true;
        goto LAB_0125d5d4;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff048._M_current,(char *)in_stack_fffffffffffff040._M_current,
                 (allocator<char> *)in_stack_fffffffffffff038);
      local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
      std::allocator<char>::~allocator(&local_a7a);
      goto LAB_0125f687;
    }
LAB_0125d5d4:
    HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
    if (RVar3 == BINARY) {
LAB_0125d6aa:
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
      HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
      if (sVar4 != 0) {
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff048._M_current,
                     (char *)in_stack_fffffffffffff040._M_current,
                     (allocator<char> *)in_stack_fffffffffffff038);
          local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
          std::allocator<char>::~allocator(&local_a99);
          goto LAB_0125f687;
        }
        oss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        oss.m_read_pos = 0;
        oss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        oss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        DataStream::DataStream((DataStream *)in_RAX);
        DataStream::operator<<
                  ((DataStream *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
        DataStream::operator>>
                  ((DataStream *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   (bool *)obj);
        DataStream::operator>>
                  ((DataStream *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   (vector<COutPoint,_std::allocator<COutPoint>_> *)obj);
        DataStream::~DataStream((DataStream *)in_RAX);
      }
LAB_0125dbfe:
      sVar5 = std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                        ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_RAX);
      HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
      if (sVar5 < 0x10) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RAX);
        std::vector<CCoin,_std::allocator<CCoin>_>::vector
                  ((vector<CCoin,_std::allocator<CCoin>_> *)in_RAX);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff010);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)in_RAX);
        std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_RAX);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                   (size_type)in_stack_fffffffffffff010);
        pCVar7 = GetChainman((any *)in_stack_fffffffffffff038,
                             (HTTPRequest *)in_stack_fffffffffffff030);
        if (pCVar7 == (ChainstateManager *)0x0) {
          local_c8e = false;
        }
        else {
          uint256::uint256((uint256 *)in_RAX);
          if (fCheckMemPool == false) {
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_RAX);
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                       in_stack_fffffffffffff038,
                       (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff030,
                       (char *)CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028),
                       (char *)in_stack_fffffffffffff020,in_stack_fffffffffffff01c,
                       SUB41((uint)in_stack_fffffffffffff018 >> 0x18,0));
            ChainstateManager::ActiveChainstate
                      ((ChainstateManager *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            Chainstate::CoinsTip
                      ((Chainstate *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
            rest_getutxos::anon_class_48_6_125dcb17::operator()
                      ((anon_class_48_6_125dcb17 *)in_stack_fffffffffffff048._M_current,
                       (CCoinsView *)in_stack_fffffffffffff040._M_current,in_stack_fffffffffffff038)
            ;
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RAX);
          }
          else {
            pCVar8 = GetMemPool((any *)in_stack_fffffffffffff038,
                                (HTTPRequest *)in_stack_fffffffffffff030);
            if (pCVar8 == (CTxMemPool *)0x0) {
              local_c8e = false;
              goto LAB_0125f61b;
            }
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_RAX);
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                       in_stack_fffffffffffff038,
                       (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff030,
                       (char *)CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028),
                       (char *)in_stack_fffffffffffff020,in_stack_fffffffffffff01c,
                       SUB41((uint)in_stack_fffffffffffff018 >> 0x18,0));
            MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_RAX);
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                       in_stack_fffffffffffff038,
                       (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff030,
                       (char *)CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028),
                       (char *)in_stack_fffffffffffff020,in_stack_fffffffffffff01c,
                       SUB41((uint)in_stack_fffffffffffff018 >> 0x18,0));
            ChainstateManager::ActiveChainstate
                      ((ChainstateManager *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            Chainstate::CoinsTip
                      ((Chainstate *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
            CCoinsViewMemPool::CCoinsViewMemPool
                      ((CCoinsViewMemPool *)
                       CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028),
                       (CCoinsView *)in_stack_fffffffffffff020,
                       (CTxMemPool *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
            rest_getutxos::anon_class_48_6_125dcb17::operator()
                      ((anon_class_48_6_125dcb17 *)in_stack_fffffffffffff048._M_current,
                       (CCoinsView *)in_stack_fffffffffffff040._M_current,in_stack_fffffffffffff038)
            ;
            CCoinsViewMemPool::~CCoinsViewMemPool(in_RAX);
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RAX);
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RAX);
          }
          i_1 = 0;
          while( true ) {
            sVar5 = std::vector<bool,_std::allocator<bool>_>::size
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT17(in_stack_fffffffffffff00f,
                                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008
                                                )));
            iVar14 = (int)((ulong)in_stack_fffffffffffff078 >> 0x20);
            HVar13 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff058 >> 0x20);
            if (sVar5 <= i_1) break;
            std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (size_type)obj);
            bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)in_RAX);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       (char *)in_stack_fffffffffffff010);
            pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT17(in_stack_fffffffffffff00f,
                                         CONCAT16(in_stack_fffffffffffff00e,
                                                  in_stack_fffffffffffff008)),(size_type)obj);
            *pbVar9 = *pbVar9 | bVar2 << ((byte)i_1 & 7);
            i_1 = i_1 + 1;
          }
          if (RVar3 == BINARY) {
            ssGetUTXOResponse.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ssGetUTXOResponse.m_read_pos = 0;
            ssGetUTXOResponse.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ssGetUTXOResponse.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            DataStream::DataStream((DataStream *)in_RAX);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (int *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (uint256 *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (vector<CCoin,_std::allocator<CCoin>_> *)obj);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            HTTPRequest::WriteHeader
                      ((HTTPRequest *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       (string *)in_stack_fffffffffffff010,
                       (string *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_c1a);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_c19);
            std::span<const_std::byte,_18446744073709551615UL>::span<DataStream_&>
                      ((span<const_std::byte,_18446744073709551615UL> *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (DataStream *)obj);
            reply_01._M_extent._M_extent_value = in_stack_fffffffffffff0b8._M_extent_value;
            reply_01._M_ptr = in_stack_fffffffffffff0b0;
            HTTPRequest::WriteReply(in_stack_fffffffffffff080,iVar14,reply_01);
            local_c8e = true;
            DataStream::~DataStream((DataStream *)in_RAX);
          }
          else if (RVar3 == HEX) {
            ssGetUTXOResponse_1.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ssGetUTXOResponse_1.m_read_pos = 0;
            ssGetUTXOResponse_1.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ssGetUTXOResponse_1.vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            DataStream::DataStream((DataStream *)in_RAX);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (int *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (uint256 *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)obj);
            DataStream::operator<<
                      ((DataStream *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (vector<CCoin,_std::allocator<CCoin>_> *)obj);
            Span<const_std::byte>::Span<DataStream>
                      ((Span<const_std::byte> *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                       (DataStream *)obj,in_RAX);
            s.m_size._0_7_ = in_stack_fffffffffffff028;
            s.m_data = (byte *)in_stack_fffffffffffff020;
            s.m_size._7_1_ = in_stack_fffffffffffff02f;
            HexStr_abi_cxx11_(s);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff010,
                           (char *)CONCAT17(in_stack_fffffffffffff00f,
                                            CONCAT16(in_stack_fffffffffffff00e,
                                                     in_stack_fffffffffffff008)));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            HTTPRequest::WriteHeader
                      ((HTTPRequest *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       (string *)in_stack_fffffffffffff010,
                       (string *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            iVar14 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator((allocator<char> *)(local_c6b + 1));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(local_c69);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
            reply._M_str = (char *)in_stack_fffffffffffff038;
            reply._M_len = (size_t)in_stack_fffffffffffff030;
            HTTPRequest::WriteReply
                      ((HTTPRequest *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       iVar14,reply);
            local_c8e = true;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            DataStream::~DataStream((DataStream *)in_RAX);
          }
          else if (RVar3 == JSON) {
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff010);
            UniValue::UniValue((UniValue *)
                               CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                               (VType)((ulong)in_stack_fffffffffffff010 >> 0x20),
                               (string *)
                               CONCAT17(in_stack_fffffffffffff00f,
                                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008
                                                )));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            script = (CScript *)local_c6b;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            UniValue::UniValue<int_&,_int,_true>
                      ((UniValue *)in_stack_fffffffffffff038,(int *)in_stack_fffffffffffff030);
            UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                             (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
            UniValue::~UniValue((UniValue *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator((allocator<char> *)local_c6b);
            pUVar12 = (UniValue *)&local_c6c;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff010);
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((UniValue *)in_stack_fffffffffffff038,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff030);
            UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                             (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
            UniValue::~UniValue((UniValue *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator((allocator<char> *)&local_c6c);
            paVar11 = &local_c6d;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,
                       (char *)in_stack_fffffffffffff040._M_current,
                       (allocator<char> *)in_stack_fffffffffffff038);
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((UniValue *)in_stack_fffffffffffff038,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff030);
            UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                             (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
            UniValue::~UniValue((UniValue *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_c6d);
            provider = local_568;
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff010);
            UniValue::UniValue((UniValue *)
                               CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                               (VType)((ulong)in_stack_fffffffffffff010 >> 0x20),
                               (string *)
                               CONCAT17(in_stack_fffffffffffff00f,
                                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008
                                                )));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::vector<CCoin,_std::allocator<CCoin>_>::begin
                      ((vector<CCoin,_std::allocator<CCoin>_> *)obj);
            __end2 = std::vector<CCoin,_std::allocator<CCoin>_>::end
                               ((vector<CCoin,_std::allocator<CCoin>_> *)obj);
            while (bVar2 = __gnu_cxx::
                           operator==<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                                     ((__normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                                       *)CONCAT17(in_stack_fffffffffffff00f,
                                                  CONCAT16(in_stack_fffffffffffff00e,
                                                           in_stack_fffffffffffff008)),
                                      (__normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                                       *)obj), ((bVar2 ^ 0xffU) & 1) != 0) {
              pCVar10 = __gnu_cxx::
                        __normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>::
                        operator*((__normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                                   *)in_RAX);
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff010);
              UniValue::UniValue((UniValue *)
                                 CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                                 (VType)((ulong)in_stack_fffffffffffff010 >> 0x20),
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff00f,
                                          CONCAT16(in_stack_fffffffffffff00e,
                                                   in_stack_fffffffffffff008)));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff048._M_current,
                         (char *)in_stack_fffffffffffff040._M_current,
                         (allocator<char> *)in_stack_fffffffffffff038);
              local_c88 = pCVar10->nHeight;
              UniValue::UniValue<int,_int,_true>
                        ((UniValue *)in_stack_fffffffffffff038,(int *)in_stack_fffffffffffff030);
              UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                               (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
              UniValue::~UniValue((UniValue *)in_RAX);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
              std::allocator<char>::~allocator(&local_c81);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff048._M_current,
                         (char *)in_stack_fffffffffffff040._M_current,
                         (allocator<char> *)in_stack_fffffffffffff038);
              ValueFromAmount(CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028));
              UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                               (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
              UniValue::~UniValue((UniValue *)in_RAX);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
              std::allocator<char>::~allocator(&local_c89);
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff010);
              UniValue::UniValue((UniValue *)
                                 CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                                 (VType)((ulong)in_stack_fffffffffffff010 >> 0x20),
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff00f,
                                          CONCAT16(in_stack_fffffffffffff00e,
                                                   in_stack_fffffffffffff008)));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
              ScriptToUniv(script,pUVar12,SUB81((ulong)paVar11 >> 0x38,0),
                           SUB81((ulong)paVar11 >> 0x30,0),provider);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff048._M_current,
                         (char *)in_stack_fffffffffffff040._M_current,
                         (allocator<char> *)in_stack_fffffffffffff038);
              UniValue::UniValue((UniValue *)
                                 CONCAT17(in_stack_fffffffffffff00f,
                                          CONCAT16(in_stack_fffffffffffff00e,
                                                   in_stack_fffffffffffff008)),obj);
              UniValue::pushKV((UniValue *)in_stack_fffffffffffff040._M_current,
                               (string *)in_stack_fffffffffffff038,in_stack_fffffffffffff030);
              UniValue::~UniValue((UniValue *)in_RAX);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX
                        );
              std::allocator<char>::~allocator((allocator<char> *)(local_c8b + 1));
              in_stack_fffffffffffff048._M_current = (uchar *)local_818;
              UniValue::UniValue((UniValue *)
                                 CONCAT17(in_stack_fffffffffffff00f,
                                          CONCAT16(in_stack_fffffffffffff00e,
                                                   in_stack_fffffffffffff008)),obj);
              UniValue::push_back(in_stack_fffffffffffff010,
                                  (UniValue *)
                                  CONCAT17(in_stack_fffffffffffff00f,
                                           CONCAT16(in_stack_fffffffffffff00e,
                                                    in_stack_fffffffffffff008)));
              UniValue::~UniValue((UniValue *)in_RAX);
              UniValue::~UniValue((UniValue *)in_RAX);
              UniValue::~UniValue((UniValue *)in_RAX);
              __gnu_cxx::__normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>::
              operator++((__normal_iterator<CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_> *)
                         in_RAX);
            }
            pUVar12 = (UniValue *)local_c8b;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,(char *)pUVar12,
                       (allocator<char> *)in_stack_fffffffffffff038);
            key = (string *)&stack0xfffffffffffff770;
            UniValue::UniValue((UniValue *)
                               CONCAT17(in_stack_fffffffffffff00f,
                                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008
                                                )),obj);
            UniValue::pushKV(pUVar12,key,in_stack_fffffffffffff030);
            UniValue::~UniValue((UniValue *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator((allocator<char> *)local_c8b);
            UniValue::write_abi_cxx11_((UniValue *)local_8d0,(int)&objGetUTXOResponse,(void *)0x0,0)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff010,
                           (char *)CONCAT17(in_stack_fffffffffffff00f,
                                            CONCAT16(in_stack_fffffffffffff00e,
                                                     in_stack_fffffffffffff008)));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            paVar11 = &local_c8c;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,(char *)pUVar12,(allocator<char> *)key);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff048._M_current,(char *)pUVar12,(allocator<char> *)key);
            HTTPRequest::WriteHeader
                      ((HTTPRequest *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                       (string *)in_stack_fffffffffffff010,
                       (string *)
                       CONCAT17(in_stack_fffffffffffff00f,
                                CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            iVar14 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_c8d);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::allocator<char>::~allocator(&local_c8c);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)req);
            reply_00._M_str = (char *)key;
            reply_00._M_len = (size_t)paVar11;
            HTTPRequest::WriteReply(req,iVar14,reply_00);
            local_c8e = true;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            UniValue::~UniValue((UniValue *)in_RAX);
            UniValue::~UniValue((UniValue *)in_RAX);
          }
          else {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((char *)req,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff00f,
                                    CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)req,
                           (char *)CONCAT17(in_stack_fffffffffffff00f,
                                            CONCAT16(in_stack_fffffffffffff00e,
                                                     in_stack_fffffffffffff008)));
            local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
            in_stack_fffffffffffff00f = local_c8e;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
          }
        }
LAB_0125f61b:
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)in_RAX);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
        std::vector<CCoin,_std::allocator<CCoin>_>::~vector
                  ((vector<CCoin,_std::allocator<CCoin>_> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
      }
      else {
        std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_RAX);
        tinyformat::format<unsigned_long,unsigned_long>
                  ((char *)in_stack_fffffffffffff038,(unsigned_long *)in_stack_fffffffffffff030,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffff02f,in_stack_fffffffffffff028));
        local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
      }
    }
    else {
      if (RVar3 == HEX) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018));
        hex_str._M_str = (char *)in_stack_fffffffffffff068;
        hex_str._M_len = (size_t)in_stack_fffffffffffff060;
        ParseHex<unsigned_char>(hex_str);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)obj);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)obj);
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)),
                   in_stack_fffffffffffff048,in_stack_fffffffffffff040);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffff00f,
                            CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
        goto LAB_0125d6aa;
      }
      if (RVar3 == JSON) {
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff048._M_current,
                     (char *)in_stack_fffffffffffff040._M_current,
                     (allocator<char> *)in_stack_fffffffffffff038);
          local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
          std::allocator<char>::~allocator(local_aca);
          goto LAB_0125f687;
        }
        goto LAB_0125dbfe;
      }
      AvailableDataFormatsString_abi_cxx11_();
      std::operator+((char *)in_stack_fffffffffffff010,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff00f,
                              CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff010,
                     (char *)CONCAT17(in_stack_fffffffffffff00f,
                                      CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008))
                    );
      local_c8e = RESTERR(in_stack_fffffffffffff060,HVar13,in_stack_fffffffffffff050);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
    }
LAB_0125f687:
    std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)
               CONCAT17(in_stack_fffffffffffff00f,
                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff00f,
                        CONCAT16(in_stack_fffffffffffff00e,in_stack_fffffffffffff008)));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX);
LAB_0125f6f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_c8e & 1);
}

Assistant:

static bool rest_getutxos(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req))
        return false;
    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uriParts;
    if (param.length() > 1)
    {
        std::string strUriParams = param.substr(1);
        uriParts = SplitString(strUriParams, '/');
    }

    // throw exception in case of an empty request
    std::string strRequestMutable = req->ReadBody();
    if (strRequestMutable.length() == 0 && uriParts.size() == 0)
        return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");

    bool fInputParsed = false;
    bool fCheckMemPool = false;
    std::vector<COutPoint> vOutPoints;

    // parse/deserialize input
    // input-format = output-format, rest/getutxos/bin requires binary input, gives binary output, ...

    if (uriParts.size() > 0)
    {
        //inputs is sent over URI scheme (/rest/getutxos/checkmempool/txid1-n/txid2-n/...)
        if (uriParts[0] == "checkmempool") fCheckMemPool = true;

        for (size_t i = (fCheckMemPool) ? 1 : 0; i < uriParts.size(); i++)
        {
            const auto txid_out{util::Split<std::string_view>(uriParts[i], '-')};
            if (txid_out.size() != 2) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }
            auto txid{Txid::FromHex(txid_out.at(0))};
            auto output{ToIntegral<uint32_t>(txid_out.at(1))};

            if (!txid || !output) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }

            vOutPoints.emplace_back(*txid, *output);
        }

        if (vOutPoints.size() > 0)
            fInputParsed = true;
        else
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
    }

    switch (rf) {
    case RESTResponseFormat::HEX: {
        // convert hex to bin, continue then with bin part
        std::vector<unsigned char> strRequestV = ParseHex(strRequestMutable);
        strRequestMutable.assign(strRequestV.begin(), strRequestV.end());
        [[fallthrough]];
    }

    case RESTResponseFormat::BINARY: {
        try {
            //deserialize only if user sent a request
            if (strRequestMutable.size() > 0)
            {
                if (fInputParsed) //don't allow sending input over URI and HTTP RAW DATA
                    return RESTERR(req, HTTP_BAD_REQUEST, "Combination of URI scheme inputs and raw post data is not allowed");

                DataStream oss{};
                oss << strRequestMutable;
                oss >> fCheckMemPool;
                oss >> vOutPoints;
            }
        } catch (const std::ios_base::failure&) {
            // abort in case of unreadable binary data
            return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
        }
        break;
    }

    case RESTResponseFormat::JSON: {
        if (!fInputParsed)
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
        break;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }

    // limit max outpoints
    if (vOutPoints.size() > MAX_GETUTXOS_OUTPOINTS)
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Error: max outpoints exceeded (max: %d, tried: %d)", MAX_GETUTXOS_OUTPOINTS, vOutPoints.size()));

    // check spentness and form a bitmap (as well as a JSON capable human-readable string representation)
    std::vector<unsigned char> bitmap;
    std::vector<CCoin> outs;
    std::string bitmapStringRepresentation;
    std::vector<bool> hits;
    bitmap.resize((vOutPoints.size() + 7) / 8);
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    decltype(chainman.ActiveHeight()) active_height;
    uint256 active_hash;
    {
        auto process_utxos = [&vOutPoints, &outs, &hits, &active_height, &active_hash, &chainman](const CCoinsView& view, const CTxMemPool* mempool) EXCLUSIVE_LOCKS_REQUIRED(chainman.GetMutex()) {
            for (const COutPoint& vOutPoint : vOutPoints) {
                Coin coin;
                bool hit = (!mempool || !mempool->isSpent(vOutPoint)) && view.GetCoin(vOutPoint, coin);
                hits.push_back(hit);
                if (hit) outs.emplace_back(std::move(coin));
            }
            active_height = chainman.ActiveHeight();
            active_hash = chainman.ActiveTip()->GetBlockHash();
        };

        if (fCheckMemPool) {
            const CTxMemPool* mempool = GetMemPool(context, req);
            if (!mempool) return false;
            // use db+mempool as cache backend in case user likes to query mempool
            LOCK2(cs_main, mempool->cs);
            CCoinsViewCache& viewChain = chainman.ActiveChainstate().CoinsTip();
            CCoinsViewMemPool viewMempool(&viewChain, *mempool);
            process_utxos(viewMempool, mempool);
        } else {
            LOCK(cs_main);
            process_utxos(chainman.ActiveChainstate().CoinsTip(), nullptr);
        }

        for (size_t i = 0; i < hits.size(); ++i) {
            const bool hit = hits[i];
            bitmapStringRepresentation.append(hit ? "1" : "0"); // form a binary string representation (human-readable for json output)
            bitmap[i / 8] |= ((uint8_t)hit) << (i % 8);
        }
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        // serialize data
        // use exact same output as mentioned in Bip64
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssGetUTXOResponse);
        return true;
    }

    case RESTResponseFormat::HEX: {
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;
        std::string strHex = HexStr(ssGetUTXOResponse) + "\n";

        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        UniValue objGetUTXOResponse(UniValue::VOBJ);

        // pack in some essentials
        // use more or less the same output as mentioned in Bip64
        objGetUTXOResponse.pushKV("chainHeight", active_height);
        objGetUTXOResponse.pushKV("chaintipHash", active_hash.GetHex());
        objGetUTXOResponse.pushKV("bitmap", bitmapStringRepresentation);

        UniValue utxos(UniValue::VARR);
        for (const CCoin& coin : outs) {
            UniValue utxo(UniValue::VOBJ);
            utxo.pushKV("height", (int32_t)coin.nHeight);
            utxo.pushKV("value", ValueFromAmount(coin.out.nValue));

            // include the script in a json output
            UniValue o(UniValue::VOBJ);
            ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
            utxo.pushKV("scriptPubKey", std::move(o));
            utxos.push_back(std::move(utxo));
        }
        objGetUTXOResponse.pushKV("utxos", std::move(utxos));

        // return json string
        std::string strJSON = objGetUTXOResponse.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}